

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_recursive_cte.cpp
# Opt level: O2

void __thiscall duckdb::PhysicalRecursiveCTE::~PhysicalRecursiveCTE(PhysicalRecursiveCTE *this)

{
  ~PhysicalRecursiveCTE(this);
  operator_delete(this);
  return;
}

Assistant:

PhysicalRecursiveCTE::~PhysicalRecursiveCTE() {
}